

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O3

void tt_var_done_item_variation_store(TT_Face face,GX_ItemVarStore itemStore)

{
  FT_Memory memory;
  GX_ItemVarData pGVar1;
  GX_VarRegion P;
  long lVar2;
  ulong uVar3;
  
  memory = (face->root).memory;
  pGVar1 = itemStore->varData;
  if (pGVar1 != (GX_ItemVarData)0x0) {
    if (itemStore->dataCount != 0) {
      lVar2 = 0;
      uVar3 = 0;
      do {
        ft_mem_free(memory,*(void **)((long)&pGVar1->regionIndices + lVar2));
        pGVar1 = itemStore->varData;
        *(undefined8 *)((long)&pGVar1->regionIndices + lVar2) = 0;
        ft_mem_free(memory,*(void **)((long)&pGVar1->deltaSet + lVar2));
        pGVar1 = itemStore->varData;
        *(undefined8 *)((long)&pGVar1->deltaSet + lVar2) = 0;
        uVar3 = uVar3 + 1;
        lVar2 = lVar2 + 0x18;
      } while (uVar3 < itemStore->dataCount);
    }
    ft_mem_free(memory,pGVar1);
    itemStore->varData = (GX_ItemVarData)0x0;
  }
  P = itemStore->varRegionList;
  if (P != (GX_VarRegion)0x0) {
    if (itemStore->regionCount != 0) {
      uVar3 = 0;
      do {
        ft_mem_free(memory,P[uVar3].axisList);
        P = itemStore->varRegionList;
        P[uVar3].axisList = (GX_AxisCoords)0x0;
        uVar3 = uVar3 + 1;
      } while (uVar3 < itemStore->regionCount);
    }
    ft_mem_free(memory,P);
    itemStore->varRegionList = (GX_VarRegion)0x0;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  tt_var_done_item_variation_store( TT_Face          face,
                                    GX_ItemVarStore  itemStore )
  {
    FT_Memory  memory = FT_FACE_MEMORY( face );
    FT_UInt    i;


    if ( itemStore->varData )
    {
      for ( i = 0; i < itemStore->dataCount; i++ )
      {
        FT_FREE( itemStore->varData[i].regionIndices );
        FT_FREE( itemStore->varData[i].deltaSet );
      }

      FT_FREE( itemStore->varData );
    }

    if ( itemStore->varRegionList )
    {
      for ( i = 0; i < itemStore->regionCount; i++ )
        FT_FREE( itemStore->varRegionList[i].axisList );

      FT_FREE( itemStore->varRegionList );
    }
  }